

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

bool __thiscall cfd::core::Psbt::IsFindGlobalXpubkey(Psbt *this,ExtPubkey *key)

{
  wally_psbt *psbt;
  bool bVar1;
  bool is_find;
  uint8_t xpub_key;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  ByteData key_data;
  ByteData key_top;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  psbt = (wally_psbt *)this->wally_psbt_pointer_;
  is_find = false;
  xpub_key = '\x01';
  ByteData::ByteData(&key_top,&xpub_key,1);
  ExtPubkey::GetData((ByteData *)&local_70,key);
  ByteData::Concat<cfd::core::ByteData>(&key_data,&key_top,(ByteData *)&local_70);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_70);
  GetPsbtGlobal((ByteData *)&local_28,&key_data,psbt,&is_find);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  bVar1 = is_find;
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key_data);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key_top);
  return bVar1;
}

Assistant:

bool Psbt::IsFindGlobalXpubkey(const ExtPubkey &key) const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  bool is_find = false;
  uint8_t xpub_key = Psbt::kPsbtGlobalXpub;
  ByteData key_top(&xpub_key, 1);
  ByteData key_data = key_top.Concat(key.GetData());
  GetPsbtGlobal(key_data, psbt_pointer, &is_find);
  return is_find;
}